

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddSlotIdInCachedScopeToNestedIndexArray
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *functionBody)

{
  uint32 uVar1;
  AuxArray<unsigned_int> *pAVar2;
  uint local_34;
  uint i;
  AuxArray<unsigned_int> *slotIdToNestedIndexArray;
  uint32 size;
  FunctionBody *functionBody_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  pAVar2 = FunctionBody::GetSlotIdInCachedScopeToNestedIndexArray(functionBody);
  slotIdToNestedIndexArray._4_4_ =
       PrependInt32(this,builder,L"SlotIdInCachedScopeToNestedIndexArray count",pAVar2->count,
                    (BufferBuilderInt32 **)0x0);
  for (local_34 = 0; local_34 < pAVar2->count; local_34 = local_34 + 1) {
    uVar1 = PrependInt32(this,builder,L"Nested function index for slot id in cached scope",
                         pAVar2[(ulong)local_34 + 1].count,(BufferBuilderInt32 **)0x0);
    slotIdToNestedIndexArray._4_4_ = uVar1 + slotIdToNestedIndexArray._4_4_;
  }
  return slotIdToNestedIndexArray._4_4_;
}

Assistant:

uint32 AddSlotIdInCachedScopeToNestedIndexArray(BufferBuilderList& builder, FunctionBody * functionBody)
    {
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start SlotIdInCachedScopeToNestedIndexArray"), magicStartOfSlotIdToNestedIndexArray);
#endif

        Js::AuxArray<uint32> * slotIdToNestedIndexArray = functionBody->GetSlotIdInCachedScopeToNestedIndexArray();
        size += PrependInt32(builder, _u("SlotIdInCachedScopeToNestedIndexArray count"), slotIdToNestedIndexArray->count);
        for (uint i = 0; i < slotIdToNestedIndexArray->count; i++)
        {
            size += PrependInt32(builder, _u("Nested function index for slot id in cached scope"), slotIdToNestedIndexArray->elements[i]);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End magicStartOfSlotIdToNestedIndexArray"), magicEndOfSlotIdToNestedIndexArray);
#endif
        return size;
    }